

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::vector<google::protobuf::TextFormat::ParseLocationRange,_std::allocator<google::protobuf::TextFormat::ParseLocationRange>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::vector<google::protobuf::TextFormat::ParseLocationRange,_std::allocator<google::protobuf::TextFormat::ParseLocationRange>_>_>_>_>::iterator,_bool>
* __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FieldDescriptor_const*,std::vector<google::protobuf::TextFormat::ParseLocationRange,std::allocator<google::protobuf::TextFormat::ParseLocationRange>>>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,std::vector<google::protobuf::TextFormat::ParseLocationRange,std::allocator<google::protobuf::TextFormat::ParseLocationRange>>>>>
::find_or_prepare_insert_non_soo<google::protobuf::FieldDescriptor_const*>
          (pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::vector<google::protobuf::TextFormat::ParseLocationRange,_std::allocator<google::protobuf::TextFormat::ParseLocationRange>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::vector<google::protobuf::TextFormat::ParseLocationRange,_std::allocator<google::protobuf::TextFormat::ParseLocationRange>_>_>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FieldDescriptor_const*,std::vector<google::protobuf::TextFormat::ParseLocationRange,std::allocator<google::protobuf::TextFormat::ParseLocationRange>>>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,std::vector<google::protobuf::TextFormat::ParseLocationRange,std::allocator<google::protobuf::TextFormat::ParseLocationRange>>>>>
          *this,FieldDescriptor **key)

{
  ctrl_t *pcVar1;
  undefined1 *capacity;
  FieldDescriptor *pFVar2;
  uint uVar3;
  ushort uVar4;
  undefined1 uVar5;
  bool bVar6;
  size_t sVar7;
  slot_type *psVar8;
  ctrl_t *pcVar9;
  uint uVar10;
  ushort uVar11;
  long lVar12;
  PolicyFunctions *pPVar13;
  PolicyFunctions *policy;
  ulong uVar14;
  ulong uVar15;
  CommonFields *common;
  __m128i match;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar19 [16];
  FindInfo target;
  ctrl_t cVar18;
  ctrl_t cVar20;
  ctrl_t cVar21;
  ctrl_t cVar22;
  
  pcVar9 = *(ctrl_t **)(this + 0x10);
  capacity = *(undefined1 **)this;
  if (((ulong)(capacity + 1) & (ulong)capacity) != 0) {
    __assert_fail("(((mask + 1) & mask) == 0 && \"not a mask\") && \"Try enabling sanitizers.\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x14c,
                  "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]")
    ;
  }
  pFVar2 = *key;
  uVar14 = ((ulong)pFVar2 ^ 0x572bc8) * -0x234dd359734ecb13;
  uVar15 = ((uVar14 >> 0x38 | (uVar14 & 0xff000000000000) >> 0x28 |
             (uVar14 & 0xff0000000000) >> 0x18 | (uVar14 & 0xff00000000) >> 8 |
             (uVar14 & 0xff000000) << 8 | (uVar14 & 0xff0000) << 0x18 | (uVar14 & 0xff00) << 0x28 |
            uVar14 << 0x38) ^ (ulong)pFVar2) * -0x234dd359734ecb13;
  common = (CommonFields *)
           (uVar15 >> 0x38 | (uVar15 & 0xff000000000000) >> 0x28 | (uVar15 & 0xff0000000000) >> 0x18
            | (uVar15 & 0xff00000000) >> 8 | (uVar15 & 0xff000000) << 8 |
            (uVar15 & 0xff0000) << 0x18 | (uVar15 & 0xff00) << 0x28 | uVar15 << 0x38);
  uVar14 = (ulong)common >> 7 ^ (ulong)pcVar9 >> 0xc;
  uVar5 = (undefined1)(uVar15 >> 0x38);
  auVar16 = ZEXT216(CONCAT11(uVar5,uVar5) & 0x7f7f);
  auVar16 = pshuflw(auVar16,auVar16,0);
  pPVar13 = (PolicyFunctions *)0x0;
  do {
    uVar14 = uVar14 & (ulong)capacity;
    pcVar1 = pcVar9 + uVar14;
    cVar18 = auVar16[0];
    auVar19[0] = -(cVar18 == *pcVar1);
    cVar20 = auVar16[1];
    auVar19[1] = -(cVar20 == pcVar1[1]);
    cVar21 = auVar16[2];
    auVar19[2] = -(cVar21 == pcVar1[2]);
    cVar22 = auVar16[3];
    auVar19[3] = -(cVar22 == pcVar1[3]);
    auVar19[4] = -(cVar18 == pcVar1[4]);
    auVar19[5] = -(cVar20 == pcVar1[5]);
    auVar19[6] = -(cVar21 == pcVar1[6]);
    auVar19[7] = -(cVar22 == pcVar1[7]);
    auVar19[8] = -(cVar18 == pcVar1[8]);
    auVar19[9] = -(cVar20 == pcVar1[9]);
    auVar19[10] = -(cVar21 == pcVar1[10]);
    auVar19[0xb] = -(cVar22 == pcVar1[0xb]);
    auVar19[0xc] = -(cVar18 == pcVar1[0xc]);
    auVar19[0xd] = -(cVar20 == pcVar1[0xd]);
    auVar19[0xe] = -(cVar21 == pcVar1[0xe]);
    auVar19[0xf] = -(cVar22 == pcVar1[0xf]);
    uVar11 = (ushort)(SUB161(auVar19 >> 7,0) & 1) | (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe | (ushort)(auVar19[0xf] >> 7) << 0xf;
    uVar10 = (uint)uVar11;
    while (uVar11 != 0) {
      uVar3 = 0;
      if (uVar10 != 0) {
        for (; (uVar10 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
        }
      }
      uVar15 = uVar3 + uVar14 & (ulong)capacity;
      lVar12 = uVar15 * 0x20;
      if (*(FieldDescriptor **)(*(long *)(this + 0x18) + lVar12) == pFVar2) {
        if (pcVar9 == (ctrl_t *)0x0) goto LAB_00304527;
        psVar8 = (slot_type *)(*(long *)(this + 0x18) + lVar12);
        pcVar9 = pcVar9 + uVar15;
        bVar6 = false;
        goto LAB_003044ec;
      }
      uVar11 = (ushort)(uVar10 - 1) & (ushort)uVar10;
      uVar10 = CONCAT22((short)(uVar10 - 1 >> 0x10),uVar11);
    }
    auVar17[0] = -(*pcVar1 == kEmpty);
    auVar17[1] = -(pcVar1[1] == kEmpty);
    auVar17[2] = -(pcVar1[2] == kEmpty);
    auVar17[3] = -(pcVar1[3] == kEmpty);
    auVar17[4] = -(pcVar1[4] == kEmpty);
    auVar17[5] = -(pcVar1[5] == kEmpty);
    auVar17[6] = -(pcVar1[6] == kEmpty);
    auVar17[7] = -(pcVar1[7] == kEmpty);
    auVar17[8] = -(pcVar1[8] == kEmpty);
    auVar17[9] = -(pcVar1[9] == kEmpty);
    auVar17[10] = -(pcVar1[10] == kEmpty);
    auVar17[0xb] = -(pcVar1[0xb] == kEmpty);
    auVar17[0xc] = -(pcVar1[0xc] == kEmpty);
    auVar17[0xd] = -(pcVar1[0xd] == kEmpty);
    auVar17[0xe] = -(pcVar1[0xe] == kEmpty);
    auVar17[0xf] = -(pcVar1[0xf] == kEmpty);
    uVar11 = (ushort)(SUB161(auVar17 >> 7,0) & 1) | (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe | (ushort)(auVar17[0xf] >> 7) << 0xf;
    if (uVar11 != 0) {
      policy = pPVar13;
      bVar6 = ShouldInsertBackwardsForDebug((size_t)capacity,(size_t)common,pcVar9);
      if (bVar6) {
        uVar4 = 0xf;
        if (uVar11 != 0) {
          for (; uVar11 >> uVar4 == 0; uVar4 = uVar4 - 1) {
          }
        }
        uVar10 = (ushort)((uVar4 ^ 0xfff0) + 0x11) - 1;
      }
      else {
        uVar10 = 0;
        if (uVar11 != 0) {
          for (; (uVar11 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
          }
        }
      }
      target.probe_length = (size_t)GetPolicyFunctions()::value;
      target.offset = (size_t)pPVar13;
      sVar7 = PrepareInsertNonSoo((container_internal *)this,common,
                                  uVar10 + uVar14 & (ulong)capacity,target,policy);
      if (*(long *)(this + 0x10) == 0) {
LAB_00304527:
        __assert_fail("ctrl != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0x9ef,
                      "absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<const google::protobuf::FieldDescriptor *, std::vector<google::protobuf::TextFormat::ParseLocationRange>>, absl::container_internal::HashEq<const google::protobuf::FieldDescriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::FieldDescriptor *>::Eq, std::allocator<std::pair<const google::protobuf::FieldDescriptor *const, std::vector<google::protobuf::TextFormat::ParseLocationRange>>>>::iterator::iterator(ctrl_t *, slot_type *, const GenerationType *) [Policy = absl::container_internal::FlatHashMapPolicy<const google::protobuf::FieldDescriptor *, std::vector<google::protobuf::TextFormat::ParseLocationRange>>, Hash = absl::container_internal::HashEq<const google::protobuf::FieldDescriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::FieldDescriptor *>::Eq, Alloc = std::allocator<std::pair<const google::protobuf::FieldDescriptor *const, std::vector<google::protobuf::TextFormat::ParseLocationRange>>>]"
                     );
      }
      pcVar9 = (ctrl_t *)(*(long *)(this + 0x10) + sVar7);
      psVar8 = (slot_type *)(sVar7 * 0x20 + *(long *)(this + 0x18));
      bVar6 = true;
LAB_003044ec:
      (__return_storage_ptr__->first).ctrl_ = pcVar9;
      (__return_storage_ptr__->first).field_1.slot_ = psVar8;
      __return_storage_ptr__->second = bVar6;
      return __return_storage_ptr__;
    }
    uVar14 = (long)&pPVar13->hash_slot + uVar14;
    pPVar13 = (PolicyFunctions *)&pPVar13->hash_slot;
    if (capacity < pPVar13) {
      __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xf7d,
                    "std::pair<iterator, bool> absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<const google::protobuf::FieldDescriptor *, std::vector<google::protobuf::TextFormat::ParseLocationRange>>, absl::container_internal::HashEq<const google::protobuf::FieldDescriptor *>::Hash, absl::container_internal::HashEq<const google::protobuf::FieldDescriptor *>::Eq, std::allocator<std::pair<const google::protobuf::FieldDescriptor *const, std::vector<google::protobuf::TextFormat::ParseLocationRange>>>>::find_or_prepare_insert_non_soo(const K &) [Policy = absl::container_internal::FlatHashMapPolicy<const google::protobuf::FieldDescriptor *, std::vector<google::protobuf::TextFormat::ParseLocationRange>>, Hash = absl::container_internal::HashEq<const google::protobuf::FieldDescriptor *>::Hash, Eq = absl::container_internal::HashEq<const google::protobuf::FieldDescriptor *>::Eq, Alloc = std::allocator<std::pair<const google::protobuf::FieldDescriptor *const, std::vector<google::protobuf::TextFormat::ParseLocationRange>>>, K = const google::protobuf::FieldDescriptor *]"
                   );
    }
  } while( true );
}

Assistant:

std::pair<iterator, bool> find_or_prepare_insert_non_soo(const K& key) {
    ABSL_SWISSTABLE_ASSERT(!is_soo());
    prefetch_heap_block();
    auto hash = hash_ref()(key);
    auto seq = probe(common(), hash);
    const ctrl_t* ctrl = control();
    while (true) {
      Group g{ctrl + seq.offset()};
      for (uint32_t i : g.Match(H2(hash))) {
        if (ABSL_PREDICT_TRUE(PolicyTraits::apply(
                EqualElement<K>{key, eq_ref()},
                PolicyTraits::element(slot_array() + seq.offset(i)))))
          return {iterator_at(seq.offset(i)), false};
      }
      auto mask_empty = g.MaskEmpty();
      if (ABSL_PREDICT_TRUE(mask_empty)) {
        size_t target = seq.offset(
            GetInsertionOffset(mask_empty, capacity(), hash, control()));
        return {iterator_at(PrepareInsertNonSoo(common(), hash,
                                                FindInfo{target, seq.index()},
                                                GetPolicyFunctions())),
                true};
      }
      seq.next();
      ABSL_SWISSTABLE_ASSERT(seq.index() <= capacity() && "full table!");
    }
  }